

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O2

void Curl_cookie_clearall(CookieInfo *cookies)

{
  if (cookies != (CookieInfo *)0x0) {
    Curl_cookie_freelist(cookies->cookies,true);
    cookies->cookies = (Cookie *)0x0;
    cookies->numcookies = 0;
  }
  return;
}

Assistant:

void Curl_cookie_clearall(struct CookieInfo *cookies)
{
  if(cookies) {
    Curl_cookie_freelist(cookies->cookies, TRUE);
    cookies->cookies = NULL;
    cookies->numcookies = 0;
  }
}